

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall cbtTaskSchedulerDefault::waitForWorkersToSleep(cbtTaskSchedulerDefault *this)

{
  CProfileSample __profile;
  
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"waitForWorkersToSleep");
  setWorkerDirectives(this,kGoToSleep);
  (*this->m_threadSupport->_vptr_cbtThreadSupportInterface[6])();
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return;
}

Assistant:

void waitForWorkersToSleep()
	{
		BT_PROFILE("waitForWorkersToSleep");
		setWorkerDirectives(WorkerThreadDirectives::kGoToSleep);
		m_threadSupport->waitForAllTasks();
		for (int i = kFirstWorkerThreadId; i < m_numThreads; i++)
		{
			ThreadLocalStorage& storage = m_threadLocalStorage[i];
			cbtAssert(storage.m_status == WorkerThreadStatus::kSleeping);
		}
	}